

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateBiasLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  RepeatedField<unsigned_long> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  void *outChannels;
  string *psVar2;
  uint __val;
  uint uVar3;
  bool bVar4;
  LayerUnion LVar5;
  WeightParams *pWVar6;
  undefined8 *puVar7;
  unsigned_long *puVar8;
  long *plVar9;
  uint uVar10;
  size_type *psVar11;
  ulong *puVar12;
  uint uVar13;
  ulong uVar14;
  undefined8 uVar15;
  _Alloc_hider _Var16;
  uint64_t expectedUnits;
  int i;
  int index;
  uint __len;
  string err;
  Result r;
  string err_1;
  string __str;
  string local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_100;
  _Alloc_hider local_f8;
  size_type local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  undefined1 local_d8 [8];
  _Alloc_hider local_d0;
  undefined1 local_c8 [24];
  string local_b0;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Result::Result((Result *)&local_100);
  validateInputCount((Result *)local_d8,layer,1,1);
  local_100 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8;
  std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_d0);
  if (local_d0._M_p != local_c8 + 8) {
    operator_delete(local_d0._M_p,local_c8._8_8_ + 1);
  }
  bVar4 = Result::good((Result *)&local_100);
  if (bVar4) {
    validateOutputCount((Result *)local_d8,layer,1,1);
    local_100 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8;
    std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_d0);
    if (local_d0._M_p != local_c8 + 8) {
      operator_delete(local_d0._M_p,local_c8._8_8_ + 1);
    }
  }
  bVar4 = Result::good((Result *)&local_100);
  if (bVar4) {
    if (this->ndArrayInterpretation != true) {
LAB_00528d0e:
      if (layer->_oneof_case_[0] == 0xfa) {
        LVar5 = layer->layer_;
      }
      else {
        LVar5.bias_ = Specification::BiasLayerParams::default_instance();
      }
      pWVar6 = (LVar5.batchnorm_)->variance_;
      if (pWVar6 == (WeightParams *)0x0) {
        pWVar6 = (WeightParams *)&Specification::_WeightParams_default_instance_;
      }
      bVar4 = 0 < (pWVar6->floatvalue_).current_size_;
      uVar13 = bVar4 + 1;
      if (((pWVar6->float16value_).ptr_)->_M_string_length == 0) {
        uVar13 = (uint)bVar4;
      }
      if (((uVar13 - (((pWVar6->rawvalue_).ptr_)->_M_string_length == 0)) + 2) -
          (uint)(((pWVar6->int8rawvalue_).ptr_)->_M_string_length == 0) < 2) {
        this_00 = &(LVar5.convolution_)->kernelsize_;
        if ((((LVar5.convolution_)->kernelsize_).current_size_ | 2U) == 3) {
          expectedUnits = 1;
          index = 0;
          do {
            puVar8 = google::protobuf::RepeatedField<unsigned_long>::Get(this_00,index);
            expectedUnits = expectedUnits * *puVar8;
            index = index + 1;
          } while (index < this_00->current_size_);
          if (this_00->current_size_ == 3) {
            pWVar6 = (WeightParams *)(LVar5.innerproduct_)->outputchannels_;
            outChannels = ((LVar5.innerproduct_)->bias_->_internal_metadata_).
                          super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                          .ptr_;
            if (outChannels < (void *)0x2) goto LAB_00529030;
            if (pWVar6 == (WeightParams *)0x0) {
              pWVar6 = (WeightParams *)&Specification::_WeightParams_default_instance_;
            }
            local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"Bias","");
            psVar2 = (layer->name_).ptr_;
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"bias","");
            validateGeneralWeightParams
                      ((Result *)local_d8,pWVar6,expectedUnits,(uint64_t)outChannels,&local_120,
                       psVar2,&local_b0);
            local_100 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_d8;
            std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_d0);
            if (local_d0._M_p != local_c8 + 8) {
              operator_delete(local_d0._M_p,local_c8._8_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) goto LAB_005290e8;
          }
          else {
            pWVar6 = (WeightParams *)(LVar5.innerproduct_)->outputchannels_;
LAB_00529030:
            if (pWVar6 == (WeightParams *)0x0) {
              pWVar6 = (WeightParams *)&Specification::_WeightParams_default_instance_;
            }
            local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"Bias","");
            psVar2 = (layer->name_).ptr_;
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"bias","");
            validateGeneralWeightParams
                      ((Result *)local_d8,pWVar6,expectedUnits,1,&local_120,psVar2,&local_b0);
            local_100 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_d8;
            std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_d0);
            if (local_d0._M_p != local_c8 + 8) {
              operator_delete(local_d0._M_p,local_c8._8_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
LAB_005290e8:
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) {
            operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
          }
          goto LAB_00529114;
        }
        std::operator+(&local_50,"Bias layer \'",(layer->name_).ptr_);
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_50);
        paVar1 = &local_b0.field_2;
        puVar12 = (ulong *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar12) {
          local_b0.field_2._M_allocated_capacity = *puVar12;
          local_b0.field_2._8_8_ = plVar9[3];
          local_b0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_b0.field_2._M_allocated_capacity = *puVar12;
          local_b0._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_b0._M_string_length = plVar9[1];
        *plVar9 = (long)puVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        uVar13 = this_00->current_size_;
        __val = -uVar13;
        if (0 < (int)uVar13) {
          __val = uVar13;
        }
        __len = 1;
        if (9 < __val) {
          uVar14 = (ulong)__val;
          uVar3 = 4;
          do {
            __len = uVar3;
            uVar10 = (uint)uVar14;
            if (uVar10 < 100) {
              __len = __len - 2;
              goto LAB_00529216;
            }
            if (uVar10 < 1000) {
              __len = __len - 1;
              goto LAB_00529216;
            }
            if (uVar10 < 10000) goto LAB_00529216;
            uVar14 = uVar14 / 10000;
            uVar3 = __len + 4;
          } while (99999 < uVar10);
          __len = __len + 1;
        }
LAB_00529216:
        local_90 = local_80;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_90,(char)__len - (char)((int)uVar13 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((ulong)(uVar13 >> 0x1f) + (long)local_90),__len,__val);
        uVar15 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != paVar1) {
          uVar15 = local_b0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar15 < local_88 + local_b0._M_string_length) {
          uVar14 = 0xf;
          if (local_90 != local_80) {
            uVar14 = local_80[0];
          }
          if (uVar14 < local_88 + local_b0._M_string_length) goto LAB_005292a0;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_90,0,(char *)0x0,(ulong)local_b0._M_dataplus._M_p);
        }
        else {
LAB_005292a0:
          puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90);
        }
        local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        psVar11 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_120.field_2._M_allocated_capacity = *psVar11;
          local_120.field_2._8_8_ = puVar7[3];
        }
        else {
          local_120.field_2._M_allocated_capacity = *psVar11;
          local_120._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_120._M_string_length = puVar7[1];
        *puVar7 = psVar11;
        puVar7[1] = 0;
        *(undefined1 *)psVar11 = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_120);
        psVar11 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_c8._0_8_ = *psVar11;
          local_c8._8_8_ = puVar7[3];
          local_d8 = (undefined1  [8])local_c8;
        }
        else {
          local_c8._0_8_ = *psVar11;
          local_d8 = (undefined1  [8])*puVar7;
        }
        local_d0._M_p = (pointer)puVar7[1];
        *puVar7 = psVar11;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        if (local_90 != local_80) {
          operator_delete(local_90,local_80[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != paVar1) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_d8);
        uVar15 = local_c8._0_8_;
        _Var16._M_p = (pointer)local_d8;
        if (local_d8 == (undefined1  [8])local_c8) goto LAB_00529162;
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8
                       ,"Bias product layer \'",(layer->name_).ptr_);
        puVar7 = (undefined8 *)std::__cxx11::string::append(local_d8);
        psVar11 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_120.field_2._M_allocated_capacity = *psVar11;
          local_120.field_2._8_8_ = puVar7[3];
          local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        }
        else {
          local_120.field_2._M_allocated_capacity = *psVar11;
          local_120._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_120._M_string_length = puVar7[1];
        *puVar7 = psVar11;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        if (local_d8 != (undefined1  [8])local_c8) {
          operator_delete((void *)local_d8,local_c8._0_8_ + 1);
        }
        Result::Result((Result *)local_d8,INVALID_MODEL_PARAMETERS,&local_120);
        local_100 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d8;
        std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_d0);
        if (local_d0._M_p != local_c8 + 8) {
          operator_delete(local_d0._M_p,local_c8._8_8_ + 1);
        }
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)__return_storage_ptr__ = local_100;
        paVar1 = &(__return_storage_ptr__->m_message).field_2;
        (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_p == &local_e8) {
          paVar1->_M_allocated_capacity =
               CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0]);
          *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_e8._8_8_;
        }
        else {
          (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_f8._M_p;
          (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
               CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0]);
        }
        (__return_storage_ptr__->m_message)._M_string_length = local_f0;
        local_f0 = 0;
        local_e8._M_local_buf[0] = '\0';
        uVar15 = local_120.field_2._M_allocated_capacity;
        _Var16._M_p = local_120._M_dataplus._M_p;
        local_f8._M_p = (pointer)&local_e8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p == &local_120.field_2) goto LAB_00529162;
      }
      operator_delete(_Var16._M_p,uVar15 + 1);
      goto LAB_00529162;
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Bias","");
    validateInputOutputRankEquality((Result *)local_d8,layer,&local_70,&this->blobNameToRank);
    local_100 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8;
    std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_d0);
    if (local_d0._M_p != local_c8 + 8) {
      operator_delete(local_d0._M_p,local_c8._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    bVar4 = Result::good((Result *)&local_100);
    if (bVar4) {
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"Bias","");
      validateRankCount((Result *)local_d8,layer,&local_120,3,-1,&this->blobNameToRank);
      local_100 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8;
      std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_d0);
      if (local_d0._M_p != local_c8 + 8) {
        operator_delete(local_d0._M_p,local_c8._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      bVar4 = Result::good((Result *)&local_100);
      if (bVar4) goto LAB_00528d0e;
    }
  }
LAB_00529114:
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)__return_storage_ptr__ = local_100;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_p == &local_e8) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_e8._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_f8._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_f0;
  local_f0 = 0;
  local_e8._M_local_buf[0] = '\0';
  local_f8._M_p = (pointer)&local_e8;
LAB_00529162:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_p != &local_e8) {
    operator_delete(local_f8._M_p,
                    CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateBiasLayer(const Specification::NeuralNetworkLayer& layer) {

    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    if (!r.good()) {
        return r;
    }

    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Bias", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "Bias", 3, -1, blobNameToRank);
        if (!r.good()) {return r;}
    }

    const auto& params = layer.bias();
    WeightParamType paramType = valueType(params.bias());

    // Only float32 or float16 parameters can be populated at any time
    if (paramType == UNSPECIFIED) {
        std::string err = "Bias product layer '" + layer.name() + "' has both full precision and half precision weights and/or bias fields populated";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }

    if (params.shape_size() != 1 && params.shape_size() != 3) {
        std::string err = "Bias layer '" + layer.name() + "' cannot be " + std::to_string(params.shape_size()) + " dimensional. Must be 1D or 3D.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // shape can be ``[1]``, ``[C]``, ``[1, H, W]`` or ``[C, H, W]``
    size_t total_shape = 1;
    for (int i = 0; i < params.shape_size(); i++) {
        total_shape *= params.shape(i);
    }
    if (params.shape_size() == 3 && params.shape(0) > 1){
        r = validateGeneralWeightParams(params.bias(), total_shape, params.shape(0), "Bias", layer.name(), "bias");
    } else {
        r = validateGeneralWeightParams(params.bias(), total_shape, 1, "Bias", layer.name(), "bias");
    }

    return r;
}